

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

void aom_fft1d_32_float(float *input,float *output,int stride)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  
  fVar47 = *input + input[stride * 0x10];
  fVar54 = *input - input[stride * 0x10];
  fVar27 = input[stride * 8] + input[stride * 0x18];
  fVar43 = input[stride * 8] - input[stride * 0x18];
  fVar52 = fVar47 + fVar27;
  fVar47 = fVar47 - fVar27;
  fVar35 = input[stride * 4] + input[stride * 0x14];
  fVar27 = input[stride * 4] - input[stride * 0x14];
  fVar28 = input[stride * 0xc] + input[stride * 0x1c];
  fVar6 = input[stride * 0xc] - input[stride * 0x1c];
  fVar32 = fVar35 + fVar28;
  fVar35 = fVar35 - fVar28;
  fVar29 = fVar52 + fVar32;
  fVar52 = fVar52 - fVar32;
  fVar28 = (fVar27 - fVar6) * 0.707107;
  fVar1 = fVar54 + fVar28;
  fVar54 = fVar54 - fVar28;
  fVar27 = (fVar6 + fVar27) * 0.707107;
  fVar2 = (0.0 - fVar43) - fVar27;
  fVar43 = fVar43 - fVar27;
  fVar7 = input[stride * 2] + input[stride * 0x12];
  fVar40 = input[stride * 2] - input[stride * 0x12];
  fVar27 = input[stride * 10] + input[stride * 0x1a];
  fVar50 = input[stride * 10] - input[stride * 0x1a];
  fVar16 = fVar7 + fVar27;
  fVar7 = fVar7 - fVar27;
  fVar23 = input[stride * 6] + input[stride * 0x16];
  fVar27 = input[stride * 6] - input[stride * 0x16];
  fVar28 = input[stride * 0xe] + input[stride * 0x1e];
  fVar36 = input[stride * 0xe] - input[stride * 0x1e];
  fVar6 = fVar23 + fVar28;
  fVar23 = fVar23 - fVar28;
  fVar8 = fVar16 + fVar6;
  fVar16 = fVar16 - fVar6;
  fVar9 = input[stride] + input[stride * 0x11];
  fVar3 = input[stride] - input[stride * 0x11];
  fVar41 = input[stride * 9] + input[stride * 0x19];
  fVar4 = input[stride * 9] - input[stride * 0x19];
  fVar44 = input[stride * 5] + input[stride * 0x15];
  fVar6 = input[stride * 5] - input[stride * 0x15];
  fVar20 = input[stride * 0xd] + input[stride * 0x1d];
  fVar55 = input[stride * 0xd] - input[stride * 0x1d];
  fVar39 = input[stride * 3] + input[stride * 0x13];
  fVar10 = input[stride * 3] - input[stride * 0x13];
  fVar17 = input[stride * 0xb] + input[stride * 0x1b];
  fVar32 = input[stride * 0xb] - input[stride * 0x1b];
  fVar30 = input[stride * 7] + input[stride * 0x17];
  fVar28 = input[stride * 7] - input[stride * 0x17];
  fVar24 = input[stride * 0xf] + input[stride * 0x1f];
  fVar48 = input[stride * 0xf] - input[stride * 0x1f];
  fVar5 = (fVar28 - fVar48) * 0.707107;
  fVar11 = fVar10 + fVar5;
  fVar49 = (fVar48 + fVar28) * 0.707107;
  fVar48 = (0.0 - fVar32) - fVar49;
  fVar51 = fVar48 * 0.92388 - fVar11 * 0.382683;
  fVar12 = fVar29 + fVar8;
  fVar13 = fVar9 + fVar41;
  fVar45 = fVar44 + fVar20;
  fVar21 = fVar13 + fVar45;
  fVar14 = fVar39 + fVar17;
  fVar31 = fVar30 + fVar24;
  fVar15 = fVar14 + fVar31;
  fVar22 = fVar21 + fVar15;
  *output = fVar12 + fVar22;
  fVar28 = (fVar27 - fVar36) * 0.707107;
  fVar53 = fVar40 + fVar28;
  fVar27 = (fVar36 + fVar27) * 0.707107;
  fVar46 = (0.0 - fVar50) - fVar27;
  fVar18 = fVar53 * 0.92388;
  fVar25 = fVar46 * 0.382683;
  fVar36 = fVar18 + fVar25 + fVar1;
  fVar26 = (fVar6 - fVar55) * 0.707107;
  fVar19 = fVar3 + fVar26;
  fVar56 = (fVar55 + fVar6) * 0.707107;
  fVar55 = (0.0 - fVar4) - fVar56;
  fVar11 = fVar11 * 0.92388;
  fVar48 = fVar48 * 0.382683;
  fVar33 = fVar11 + fVar48 + fVar19;
  fVar37 = fVar55 + fVar51;
  fVar34 = fVar33 * 0.980785;
  fVar38 = fVar37 * 0.19509;
  output[stride] = fVar34 + fVar38 + fVar36;
  fVar40 = fVar40 - fVar28;
  fVar50 = fVar50 - fVar27;
  fVar9 = fVar9 - fVar41;
  fVar44 = fVar44 - fVar20;
  fVar39 = fVar39 - fVar17;
  fVar30 = fVar30 - fVar24;
  fVar27 = (fVar7 - fVar23) * 0.707107;
  fVar24 = fVar47 + fVar27;
  fVar42 = (fVar39 - fVar30) * 0.707107;
  fVar41 = fVar9 + fVar42;
  fVar20 = (fVar30 + fVar39) * 0.707107;
  fVar30 = (0.0 - fVar44) - fVar20;
  fVar28 = fVar41 * 0.92388;
  fVar39 = fVar30 * 0.382683;
  output[stride * 2] = fVar28 + fVar39 + fVar24;
  fVar6 = fVar46 * 0.92388 - fVar53 * 0.382683;
  fVar17 = fVar50 * 0.382683 - fVar40 * 0.92388;
  fVar40 = fVar40 * 0.382683;
  fVar50 = fVar50 * 0.92388;
  fVar46 = fVar40 + fVar50 + fVar54;
  fVar54 = ((0.0 - fVar40) - fVar50) + fVar54;
  fVar40 = fVar43 + fVar17;
  fVar17 = (0.0 - fVar43) + fVar17;
  fVar47 = fVar47 - fVar27;
  fVar50 = (fVar23 + fVar7) * 0.707107;
  fVar27 = (0.0 - fVar35) - fVar50;
  fVar35 = fVar35 - fVar50;
  fVar3 = fVar3 - fVar26;
  fVar4 = fVar4 - fVar56;
  fVar10 = fVar10 - fVar5;
  fVar32 = fVar32 - fVar49;
  fVar50 = fVar32 * 0.382683 - fVar10 * 0.92388;
  fVar10 = fVar10 * 0.382683;
  fVar32 = fVar32 * 0.92388;
  fVar43 = fVar10 + fVar32 + fVar3;
  fVar23 = fVar4 + fVar50;
  fVar5 = fVar43 * 0.83147;
  fVar26 = fVar23 * 0.55557;
  output[stride * 3] = fVar5 + fVar26 + fVar46;
  fVar13 = fVar13 - fVar45;
  fVar14 = fVar14 - fVar31;
  fVar7 = (fVar13 - fVar14) * 0.707107;
  output[stride * 4] = fVar52 + fVar7;
  fVar3 = ((0.0 - fVar10) - fVar32) + fVar3;
  fVar50 = (0.0 - fVar4) + fVar50;
  fVar31 = fVar3 * 0.55557;
  fVar4 = fVar50 * 0.83147;
  output[stride * 5] = fVar4 + fVar31 + fVar54;
  fVar1 = ((0.0 - fVar18) - fVar25) + fVar1;
  fVar18 = fVar2 + fVar6;
  fVar6 = (0.0 - fVar2) + fVar6;
  fVar9 = fVar9 - fVar42;
  fVar44 = fVar44 - fVar20;
  fVar2 = fVar9 * 0.382683;
  fVar10 = fVar44 * 0.92388;
  output[stride * 6] = fVar2 + fVar10 + fVar47;
  fVar19 = ((0.0 - fVar11) - fVar48) + fVar19;
  fVar51 = (0.0 - fVar55) + fVar51;
  fVar48 = fVar19 * 0.19509;
  fVar32 = fVar51 * 0.980785;
  output[stride * 7] = fVar32 + fVar48 + fVar1;
  output[stride * 8] = fVar29 - fVar8;
  output[stride * 9] = ((0.0 - fVar48) - fVar32) + fVar1;
  output[stride * 10] = ((0.0 - fVar2) - fVar10) + fVar47;
  output[stride * 0xb] = ((0.0 - fVar31) - fVar4) + fVar54;
  output[stride * 0xc] = fVar52 - fVar7;
  output[stride * 0xd] = ((0.0 - fVar5) - fVar26) + fVar46;
  output[stride * 0xe] = ((0.0 - fVar28) - fVar39) + fVar24;
  output[stride * 0xf] = ((0.0 - fVar34) - fVar38) + fVar36;
  output[stride * 0x10] = fVar12 - fVar22;
  fVar2 = fVar37 * 0.980785 - fVar33 * 0.19509;
  output[stride * 0x11] = fVar18 + fVar2;
  fVar4 = fVar30 * 0.92388 - fVar41 * 0.382683;
  output[stride * 0x12] = fVar27 + fVar4;
  fVar1 = fVar23 * 0.83147 - fVar43 * 0.55557;
  output[stride * 0x13] = fVar40 + fVar1;
  fVar32 = (fVar14 + fVar13) * 0.707107;
  output[stride * 0x14] = (0.0 - fVar16) - fVar32;
  fVar28 = fVar50 * 0.55557 - fVar3 * 0.83147;
  output[stride * 0x15] = fVar17 + fVar28;
  fVar9 = fVar44 * 0.382683 - fVar9 * 0.92388;
  output[stride * 0x16] = fVar35 + fVar9;
  fVar3 = fVar51 * 0.19509 - fVar19 * 0.980785;
  output[stride * 0x17] = fVar6 + fVar3;
  output[stride * 0x18] = (fVar15 - fVar21) + 0.0;
  output[stride * 0x19] = (0.0 - fVar6) + fVar3;
  output[stride * 0x1a] = (0.0 - fVar35) + fVar9;
  output[stride * 0x1b] = (0.0 - fVar17) + fVar28;
  output[stride * 0x1c] = fVar16 - fVar32;
  output[stride * 0x1d] = (0.0 - fVar40) + fVar1;
  output[stride * 0x1e] = (0.0 - fVar27) + fVar4;
  output[stride * 0x1f] = (0.0 - fVar18) + fVar2;
  return;
}

Assistant:

void aom_fft2x2_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 2, aom_fft1d_2_float, simple_transpose,
                 unpack_2d_output, 1);
}